

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::init
          (ShaderBuiltinConstantCase<int> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  int extraout_EAX;
  undefined7 extraout_var;
  NotSupportedError *pNVar4;
  undefined7 extraout_var_00;
  long *plVar5;
  size_type *psVar6;
  string *psVar7;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  psVar7 = &this->m_requiredExt;
  iVar3 = std::__cxx11::string::compare((char *)psVar7);
  if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 == 0)) {
    if (bVar1) {
      return iVar3;
    }
    std::operator+(&local_40,"The test requires a 3.2 context or support for the extension ",psVar7)
    ;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_60.field_2._M_allocated_capacity = *psVar6;
      local_60.field_2._8_8_ = plVar5[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar6;
      local_60._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_60._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       (this->m_requiredExt)._M_dataplus._M_p);
    iVar3 = (int)CONCAT71(extraout_var_00,bVar2);
    if (!bVar2) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,local_60._M_dataplus._M_p,
                 "m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str())",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                 ,0xa8);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      iVar3 = extraout_EAX;
    }
  }
  else if ((this->m_requiredExt)._M_string_length != 0) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       (this->m_requiredExt)._M_dataplus._M_p);
    iVar3 = (int)CONCAT71(extraout_var,bVar2);
    if (!bVar2) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+(&local_60,psVar7," not supported");
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_60);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (bVar1) {
    return iVar3;
  }
  psVar7 = &this->m_varName;
  iVar3 = std::__cxx11::string::compare((char *)psVar7);
  if ((((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 != 0)) &&
      ((iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 != 0 &&
       ((iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 != 0 &&
        (iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 != 0)))))) &&
     (iVar3 = std::__cxx11::string::compare((char *)psVar7), iVar3 != 0)) {
    return iVar3;
  }
  std::operator+(&local_40,"The test requires a 3.2 context. The constant \'",psVar7);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar6) {
    local_60.field_2._M_allocated_capacity = *psVar6;
    local_60.field_2._8_8_ = plVar5[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar6;
  }
  local_60._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar4,local_60._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0xb6);
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderBuiltinConstantCase<DataType>::init (void)
{
	const bool supportsES32 = contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_requiredExt == "GL_OES_sample_variables" || m_requiredExt == "GL_EXT_geometry_shader" || m_requiredExt == "GL_EXT_tessellation_shader")
	{
		if(!supportsES32)
		{
			const std::string message = "The test requires a 3.2 context or support for the extension " + m_requiredExt + ".";
			TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()), message.c_str());
		}
	}
	else if (!m_requiredExt.empty() && !m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()))
			throw tcu::NotSupportedError(m_requiredExt + " not supported");

	if (!supportsES32 && (m_varName == "gl_MaxTessControlImageUniforms"	||
		m_varName == "gl_MaxTessEvaluationImageUniforms"			||
		m_varName == "gl_MaxTessControlAtomicCounters"				||
		m_varName == "gl_MaxTessEvaluationAtomicCounters"			||
		m_varName == "gl_MaxTessControlAtomicCounterBuffers"		||
		m_varName == "gl_MaxTessEvaluationAtomicCounterBuffers"))
	{
		std::string message = "The test requires a 3.2 context. The constant '" + m_varName + "' is not supported.";
		TCU_THROW(NotSupportedError, message.c_str());
	}
}